

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O0

void __thiscall trng::negative_binomial_dist::param_type::calc_probabilities(param_type *this)

{
  vector<double,_std::allocator<double>_> *in_RDI;
  double p;
  int x;
  value_type_conflict6 *in_stack_ffffffffffffffb8;
  param_type *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *this_00;
  undefined1 local_20 [32];
  
  memset(local_20,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3898fe);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_ffffffffffffffd0,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffc8);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  this_00 = (vector<double,_std::allocator<double>_> *)0x0;
  while ((double)this_00 < 0.999755859375) {
    this_00 = (vector<double,_std::allocator<double>_> *)
              cdf(in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20));
    std::vector<double,_std::allocator<double>_>::push_back(this_00,&in_stack_ffffffffffffffc8->p_);
  }
  std::vector<double,_std::allocator<double>_>::push_back(in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void calc_probabilities() {
        P_ = std::vector<double>();
        int x{0};
        double p{0.0};
        while (p < 1.0 - 1.0 / 4096.0) {
          p = cdf(x);
          P_.push_back(p);
          ++x;
        }
        P_.push_back(1);
      }